

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

int get_physical_address_wtlb
              (CPUPPCState_conflict2 *env,mmu_ctx_t_conflict *ctx,target_ulong eaddr,int rw,
              int access_type,int mmu_idx)

{
  CPUPPCState_conflict2 *env_00;
  ppc6xx_tlb_t_conflict2 *ppVar1;
  powerpc_mmu_t pVar2;
  ppcemb_tlb_t_conflict2 *ppVar3;
  uint uVar4;
  target_ulong tVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  target_ulong *ptVar9;
  char cVar10;
  sbyte sVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ppcmas_tlb_t *tlb;
  char *fmt;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  byte bVar28;
  bool bVar29;
  hwaddr raddr;
  int in_stack_ffffffffffffff68;
  int local_70;
  ppcemb_tlb_t_conflict2 local_68;
  ulong local_40;
  long local_38;
  
  uVar20 = (ulong)(uint)mmu_idx;
  uVar13 = 0;
  pVar2 = env->mmu_model;
  uVar26 = (ulong)(pVar2 - POWERPC_MMU_SOFT_6xx);
  if (7 < pVar2 - POWERPC_MMU_SOFT_6xx) {
    fmt = "Unknown or invalid MMU model\n";
    uVar15 = uVar26;
LAB_00b6cf70:
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,fmt,uVar15,uVar13);
  }
  uVar13 = (ulong)((uint)(access_type == 0x10) * 0x10 + 0x10 & (uint)env->msr);
  uVar15 = (long)&switchD_00b6c26a::switchdataD_00dbeccc +
           (long)(int)(&switchD_00b6c26a::switchdataD_00dbeccc)[uVar26];
  switch(uVar26) {
  default:
    if (uVar13 == 0) break;
    uVar19 = (uint)eaddr;
    if ((ulong)env->nb_BATs == 0) {
      iVar7 = -1;
    }
    else {
      uVar13 = (ulong)(access_type == 0x10);
      uVar26 = 0;
      do {
        uVar20 = env->DBAT[(ulong)(access_type == 0x10) * 2][uVar26];
        uVar23 = (uint)env->msr;
        uVar6 = (uint)uVar20;
        if (((uVar23 >> 0xe & 1) == 0) && ((uVar20 & 2) != 0)) {
LAB_00b6c2ea:
          bVar29 = true;
          uVar23 = (uint)env->DBAT[uVar13 * 2 + 1][uVar26] & 3;
          if (uVar23 == 0) {
            iVar7 = -2;
            uVar23 = 0;
          }
          else {
            if (uVar23 == 2) {
              uVar23 = 7;
            }
            else {
              uVar23 = 5;
            }
            iVar7 = 0;
          }
        }
        else {
          bVar29 = false;
          iVar7 = -2;
          if ((uVar23 >> 0xe & 1) == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = 0;
            bVar29 = false;
            if ((uVar20 & 1) != 0) goto LAB_00b6c2ea;
          }
        }
        if ((((uVar6 ^ uVar19) & 0xf0000000) == 0) &&
           (uVar16 = (uVar6 & 0x1ffc) << 0xf,
           bVar29 && (~uVar16 & uVar19 & 0xffe0000) == (uVar6 & 0xffe0000))) {
          ctx->raddr = (ulong)(uVar19 & (uVar16 | 0x1f000) |
                              (uint)env->DBAT[uVar13 * 2 + 1][uVar26] & 0xfffe0000);
          ctx->prot = uVar23;
          if (access_type != 0x10) {
            if (rw == 0) {
              iVar7 = (uVar23 & 1) * 2 + -2;
            }
            else {
              iVar7 = (uVar23 & 2) - 2;
            }
          }
          goto LAB_00b6ca4a;
        }
        uVar26 = uVar26 + 1;
      } while (env->nb_BATs != uVar26);
      iVar7 = -1;
    }
LAB_00b6ca4a:
    if (-1 < iVar7) {
      return iVar7;
    }
    uVar23 = (uint)env->msr >> 0xe;
    ctx->eaddr = eaddr;
    uVar13 = env->sr[eaddr >> 0x1c];
    uVar6 = (uint)uVar13;
    if (((uVar6 >> 0x1d & 1) == 0) || (uVar16 = 1, (uVar23 & 1) == 0)) {
      uVar16 = (uint)((uVar23 & 1) == 0 & (byte)(uVar13 >> 0x1e) & 3);
    }
    ctx->key = uVar16;
    uVar13 = uVar13 >> 0x1c;
    uVar19 = uVar19 & 0xfffffff;
    uVar23 = uVar19 >> 0x16 | (uVar6 & 0xffffff) << 7;
    ctx->nx = (uint)uVar13 & 1;
    ctx->ptem = (ulong)uVar23;
    if (-1 < (int)uVar6) {
      if ((access_type == 0x10) && ((uVar13 & 1) != 0)) {
        return -3;
      }
      uVar26 = (ulong)(uVar6 & 0xffffff ^ uVar19 >> 0xc);
      ctx->hash[0] = uVar26;
      ctx->hash[1] = ~uVar26;
      ctx->raddr = 0xffffffffffffffff;
      iVar7 = env->nb_ways;
      if (iVar7 < 1) {
        uVar19 = 0xffffffff;
        local_70 = -1;
      }
      else {
        iVar12 = env->tlb_per_way;
        uVar18 = (uint)(eaddr >> 0xc) & iVar12 - 1U;
        iVar17 = 0;
        local_70 = -1;
        uVar6 = uVar18;
        uVar21 = 0xffffffff;
        do {
          uVar19 = uVar6;
          if ((access_type == 0x10) && (env->id_tlbs == 1)) {
            uVar19 = iVar17 * iVar12 + uVar18 + env->nb_tlb;
          }
          if ((eaddr & 0xfffffffffffff000) == (env->tlb).tlb6[(int)uVar19].EPN) {
            ppVar1 = (env->tlb).tlb6 + (int)uVar19;
            uVar25 = (uint)ppVar1->pte0;
            iVar24 = -1;
            if (((uVar25 & 0x80000040) == 0x80000000) && ((uVar25 & 0x7fffffbf) == uVar23)) {
              uVar26 = ppVar1->pte1;
              if ((ctx->raddr == 0xffffffffffffffff) ||
                 (iVar24 = -3, ((ctx->raddr ^ uVar26) & 0xfffffffffffff07b) == 0)) {
                if (uVar16 == 0) {
                  uVar25 = (uint)((~(uint)uVar26 & 3) != 0) * 2 + 1;
                }
                else {
                  uVar25 = *(uint *)(&DAT_00db64ec + (ulong)((uint)uVar26 & 3) * 4);
                }
                uVar4 = uVar25 | 4;
                if ((uVar13 & 1) != 0) {
                  uVar4 = uVar25;
                }
                ctx->raddr = uVar26;
                ctx->prot = uVar4;
                iVar24 = (uint)((uVar13 & 1) == 0) * 2 + -2;
                if (access_type != 0x10) {
                  if (rw == 0) {
                    iVar24 = (uVar4 & 1) * 2 + -2;
                  }
                  else {
                    iVar24 = (uVar4 & 2) - 2;
                  }
                }
              }
            }
            if (iVar24 == -2) {
              local_70 = -2;
              uVar21 = uVar19;
            }
            else {
              if (iVar24 == -3) {
                return -1;
              }
              if (iVar24 == 0) {
                local_70 = 0;
                goto LAB_00b6cdda;
              }
            }
          }
          uVar19 = uVar21;
          iVar17 = iVar17 + 1;
          uVar6 = uVar6 + iVar12;
          iVar7 = iVar7 + -1;
          uVar21 = uVar19;
        } while (iVar7 != 0);
      }
      if (uVar19 == 0xffffffff) {
        return local_70;
      }
LAB_00b6cdda:
      ptVar9 = &(env->tlb).tlb6[(int)uVar19].pte1;
      if (((uint)*ptVar9 >> 8 & 1) == 0) {
        *ptVar9 = *ptVar9 | 0x100;
      }
      if (-1 < (char)*ptVar9) {
        if ((rw == 1) && (local_70 == 0)) {
          *ptVar9 = *ptVar9 | 0x80;
          return 0;
        }
        *(byte *)&ctx->prot = (byte)ctx->prot & 0xfd;
        return local_70;
      }
      return local_70;
    }
    uVar23 = (uint)env->sr[eaddr >> 0x1c];
    if ((uVar23 & 0x1ff00000) == 0x7f00000) {
      ctx->raddr = (ulong)(uVar23 << 0x1c | uVar19);
      goto LAB_00b6c6f7;
    }
    uVar19 = access_type << 0x1c | access_type - 0x10U >> 4;
    if (uVar19 == 1) {
      if (rw == 1) {
        if (uVar16 == 0) {
          return -2;
        }
      }
      else if (uVar16 != 0 || rw != 0) {
        return -2;
      }
      ctx->raddr = eaddr;
      return 2;
    }
    if (uVar19 != 5) {
      return -4;
    }
    ctx->raddr = eaddr;
    goto LAB_00b6c6fe;
  case 2:
  case 3:
    if (uVar13 != 0) {
      iVar7 = env->nb_tlb;
      if ((long)iVar7 < 1) {
        return -1;
      }
      tVar5 = env->msr;
      uVar19 = 4;
      if (access_type != 0x10) {
        uVar19 = 2 - (rw == 0);
      }
      uVar13 = 0xffffffffffffffff;
      iVar12 = -1;
      lVar27 = 0;
      do {
        ppVar3 = (env->tlb).tlbe;
        uVar23 = *(uint *)((long)&ppVar3->prot + lVar27);
        bVar29 = true;
        if ((uVar23 & 8) != 0) {
          uVar26 = *(ulong *)((long)&ppVar3->PID + lVar27);
          lVar14 = *(long *)((long)&ppVar3->size + lVar27);
          if (((uVar26 == 0) || (uVar26 == (uint)env->spr[0x3b1])) &&
             (uVar26 = -lVar14, (uVar26 & eaddr) == *(ulong *)((long)&ppVar3->EPN + lVar27))) {
            uVar13 = lVar14 - 1U & eaddr | uVar26 & *(ulong *)((long)&ppVar3->RPN + lVar27);
            bVar29 = false;
          }
        }
        if (!bVar29) {
          uVar6 = (uint)tVar5;
          switch((uint)(env->spr[0x3b0] >>
                       ((byte)~*(byte *)((long)&ppVar3->attr + lVar27) >> 3 & 0x1e)) & 3) {
          case 0:
            if ((uVar6 >> 0xe & 1) == 0) goto switchD_00b6c448_caseD_1;
            env->spr[0x3d4] = 0x400000;
            ctx->prot = 0;
            goto LAB_00b6c4b9;
          case 2:
            if ((uVar6 >> 0xe & 1) == 0) goto switchD_00b6c448_caseD_3;
          case 1:
switchD_00b6c448_caseD_1:
            ctx->prot = uVar23;
            bVar29 = (uVar23 & uVar19) == 0;
            if (bVar29) {
              env->spr[0x3d4] = 0;
LAB_00b6c4b9:
              iVar12 = -2;
            }
            else {
              iVar12 = (uint)!bVar29 * 2 + -2;
            }
            break;
          case 3:
switchD_00b6c448_caseD_3:
            ctx->prot = 7;
            iVar12 = 0;
          }
          if (-1 < iVar12) {
            ctx->raddr = uVar13;
            goto LAB_00b6c6fe;
          }
        }
        lVar27 = lVar27 + 0x28;
        if ((long)iVar7 * 0x28 == lVar27) {
          return iVar12;
        }
      } while( true );
    }
    break;
  case 4:
    if (uVar13 != 0) {
      fmt = "PowerPC in real mode do not do any translation\n";
      goto LAB_00b6cf70;
    }
    break;
  case 5:
    fmt = "MPC8xx MMU model is not implemented\n";
    goto LAB_00b6cf70;
  case 6:
    local_68.RPN = 0xffffffffffffffff;
    if (0 < env->nb_tlb) {
      tVar5 = env->spr[0x30];
      lVar14 = 0;
      lVar27 = 0;
      do {
        ppVar3 = (env->tlb).tlbe;
        env_00 = (CPUPPCState_conflict2 *)((long)&ppVar3->RPN + lVar14);
        iVar7 = ppcemb_tlb_check(env_00,&local_68,(hwaddr *)eaddr,(ulong)(uint)tVar5,
                                 (uint)(env->nb_pids == 0),(int)uVar20,in_stack_ffffffffffffff68);
        if (iVar7 < 0) {
          if (((env->spr[0x279] != 0) && ((*(byte *)((long)&ppVar3->prot + lVar14) & 8) != 0)) &&
             (uVar13 = *(ulong *)((long)&ppVar3->PID + lVar14),
             uVar13 == 0 || uVar13 == (env->spr[0x279] & 0xffffffff))) {
            lVar8 = *(long *)((long)&ppVar3->size + lVar14);
            uVar13 = -lVar8;
            if ((uVar13 & eaddr) != *(ulong *)((long)&ppVar3->EPN + lVar14)) goto LAB_00b6c5df;
LAB_00b6c632:
            local_68.RPN = lVar8 - 1U & eaddr | uVar13 & env_00->gpr[0];
            goto LAB_00b6c536;
          }
LAB_00b6c5df:
          iVar7 = -1;
          if (((env->spr[0x27a] != 0) && ((*(byte *)((long)&ppVar3->prot + lVar14) & 8) != 0)) &&
             (uVar13 = *(ulong *)((long)&ppVar3->PID + lVar14),
             uVar13 == 0 || uVar13 == (env->spr[0x27a] & 0xffffffff))) {
            lVar8 = *(long *)((long)&ppVar3->size + lVar14);
            uVar13 = -lVar8;
            if ((uVar13 & eaddr) == *(ulong *)((long)&ppVar3->EPN + lVar14)) goto LAB_00b6c632;
          }
        }
        else {
LAB_00b6c536:
          uVar19 = *(uint *)((long)&ppVar3->prot + lVar14);
          uVar6 = (uint)env->msr;
          uVar23 = uVar19 >> 4;
          if ((uVar6 >> 0xe & 1) != 0) {
            uVar23 = uVar19;
          }
          uVar19 = *(uint *)((long)&ppVar3->attr + lVar14) & 1;
          if (access_type == 0x10) {
            iVar7 = -1;
            if (((uint)(env->msr >> 5) & 1) == uVar19) {
              ctx->prot = uVar23 & 0xf;
              iVar12 = -3;
              uVar23 = uVar23 & 4;
joined_r0x00b6c684:
              iVar7 = 0;
              if (uVar23 == 0) {
LAB_00b6c592:
                iVar7 = iVar12;
              }
            }
          }
          else {
            iVar7 = -1;
            if ((uVar6 >> 4 & 1) == uVar19) {
              iVar7 = 0;
              ctx->prot = uVar23 & 0xf;
              if ((rw != 0) || ((uVar23 & 1) == 0)) {
                iVar12 = -2;
                if (rw != 0) {
                  uVar23 = uVar23 & 2;
                  goto joined_r0x00b6c684;
                }
                goto LAB_00b6c592;
              }
            }
          }
        }
        if (iVar7 != -1) goto joined_r0x00b6ca1f;
        lVar27 = lVar27 + 1;
        lVar14 = lVar14 + 0x28;
      } while (lVar27 < env->nb_tlb);
    }
    iVar7 = -1;
    goto joined_r0x00b6ca1f;
  case 7:
    local_68.RPN = 0xffffffffffffffff;
    local_68.size = eaddr >> 0xc;
    local_68._32_8_ = (ulong)(mmu_idx == 9) * 8 + 0x28b0;
    iVar7 = -1;
    lVar27 = 0;
    do {
      local_68.PID._0_4_ = (uint)env->spr[lVar27 + 0x2b0];
      bVar29 = 0xffffff < (uint)local_68.PID;
      iVar12 = iVar7;
      if (bVar29) {
        uVar19 = (uint)local_68.PID & 0xfff;
        if (uVar19 == 0) {
          cVar10 = '\0';
        }
        else {
          iVar12 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
            }
          }
          cVar10 = (char)iVar12;
        }
        local_68.PID._0_4_ = (uint)local_68.PID >> 0x18;
        uVar13 = (ulong)(uint)local_68.PID;
        iVar12 = 0;
        if ((uint)local_68.PID != 0) {
          for (; ((uint)local_68.PID >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
          }
        }
        local_38 = (ulong)(~(-1 << (cVar10 - (byte)iVar12 & 0x1f)) & (uint)local_68.size) <<
                   ((byte)iVar12 & 0x3f);
        local_68.PID._4_4_ = (uint)local_68.PID + 0x7fffffff;
        local_68.PID._0_4_ = (uint)local_68.PID + ((uint)local_68.PID == 0);
        uVar23 = 0;
        bVar29 = true;
        local_68.EPN._4_4_ = uVar19;
        local_40 = uVar13;
        do {
          uVar6 = uVar23 & local_68.PID._4_4_ | (uint)local_38;
          if ((int)uVar6 < (int)uVar19) {
            if (lVar27 != 0) {
              lVar14 = 0;
              do {
                uVar6 = uVar6 + ((uint)env->spr[lVar14 + 0x2b0] & 0xfff);
                lVar14 = lVar14 + 1;
              } while (lVar27 != lVar14);
            }
            tlb = (ppcmas_tlb_t *)((env->tlb).tlb6 + (int)uVar6);
          }
          else {
            tlb = (ppcmas_tlb_t *)0x0;
          }
          if (tlb != (ppcmas_tlb_t *)0x0) {
            if ((mmu_idx & 0xfffffffeU) == 8) {
              uVar19 = *(uint *)((long)env->gpr + local_68._32_8_);
              bVar22 = (byte)(uVar19 >> 0x18);
              bVar28 = bVar22 >> 6;
              bVar22 = bVar22 >> 7;
              iVar7 = ppcmas_tlb_check(env,tlb,&local_68.RPN,eaddr,uVar19 & 0xff);
              if (iVar7 < 0) {
                iVar12 = -1;
                goto LAB_00b6c9d4;
              }
LAB_00b6c8a2:
              uVar19 = (uint)tlb->mas7_3;
              if (bVar22 == 0) {
                uVar6 = uVar19 >> 1 & 2 | uVar19 & 1;
                sVar11 = 2;
              }
              else {
                uVar6 = uVar19 >> 2 & 2 | uVar19 >> 1 & 1;
                sVar11 = 3;
              }
              uVar19 = uVar19 >> sVar11 & 4;
              if (access_type == 0x10) {
                if ((mmu_idx & 0xfffffffeU) == 8) {
                  __assert_fail("!use_epid",
                                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu_helper.c"
                                ,0x432,
                                "int mmubooke206_check_tlb(CPUPPCState *, ppcmas_tlb_t *, hwaddr *, int *, target_ulong, int, int, int)"
                               );
                }
                iVar12 = -1;
                if (((uint)env->msr >> 5 & 1) == (uint)((tlb->mas1 >> 0xc & 1) != 0)) {
                  ctx->prot = uVar6 + uVar19;
                  iVar7 = -3;
joined_r0x00b6c96b:
                  iVar12 = 0;
                  if (uVar19 == 0) {
LAB_00b6c96d:
                    iVar12 = iVar7;
                  }
                }
              }
              else {
                iVar12 = -1;
                if ((tlb->mas1 >> 0xc & 1) == (uint)(bVar28 & 1)) {
                  iVar12 = 0;
                  ctx->prot = uVar6 + uVar19;
                  if ((rw != 0) || ((uVar6 & 1) == 0)) {
                    iVar7 = -2;
                    if (rw != 0) {
                      uVar19 = uVar6 & 0xfffffffe;
                      goto joined_r0x00b6c96b;
                    }
                    goto LAB_00b6c96d;
                  }
                }
              }
            }
            else {
              bVar28 = (byte)((env->msr & 0xffffffff) >> 4) & 0xf;
              bVar22 = (byte)((uint)env->msr >> 0xe) & 1;
              iVar7 = ppcmas_tlb_check(env,tlb,&local_68.RPN,eaddr,(uint32_t)env->spr[0x30]);
              if ((-1 < iVar7) ||
                 ((env->spr[0x279] != 0 &&
                  (iVar7 = ppcmas_tlb_check(env,tlb,&local_68.RPN,eaddr,(uint32_t)env->spr[0x279]),
                  -1 < iVar7)))) goto LAB_00b6c8a2;
              iVar12 = -1;
              if (env->spr[0x27a] != 0) {
                iVar7 = ppcmas_tlb_check(env,tlb,&local_68.RPN,eaddr,(uint32_t)env->spr[0x27a]);
                iVar12 = -1;
                if (-1 < iVar7) goto LAB_00b6c8a2;
              }
            }
LAB_00b6c9d4:
            iVar7 = -1;
            uVar13 = local_40;
            uVar19 = local_68.EPN._4_4_;
            if (iVar12 != -1) break;
          }
          uVar23 = uVar23 + 1;
          bVar29 = uVar23 < (uint)uVar13;
          iVar12 = iVar7;
        } while (uVar23 != (uint)local_68.PID);
      }
      iVar7 = iVar12;
    } while ((!bVar29) && (lVar27 = lVar27 + 1, lVar27 != 4));
joined_r0x00b6ca1f:
    if (-1 < iVar7) {
      ctx->raddr = local_68.RPN;
      return iVar7;
    }
    return iVar7;
  }
  ctx->raddr = eaddr;
  ctx->prot = 5;
  if (pVar2 < POWERPC_MMU_BOOKE206) {
    if ((0x15cU >> (pVar2 & 0x1f) & 1) == 0) {
      if (pVar2 != POWERPC_MMU_SOFT_4xx_Z) goto LAB_00b6cf77;
      iVar7 = 0;
      if ((env->msr & 8) != 0) {
        if (((env->pb[1] <= eaddr) || (eaddr < env->pb[0])) ||
           (bVar29 = true, env->pb[1] <= env->pb[0])) {
          if (eaddr < env->pb[2] || env->pb[3] <= env->pb[2]) {
            bVar29 = false;
          }
          else {
            bVar29 = eaddr < env->pb[3];
          }
        }
        if (bVar29 == (((uint)env->msr >> 2 & 1) != 0)) {
          ctx->prot = 7;
        }
        else {
          iVar7 = (uint)(rw != 1) * 2 + -2;
        }
      }
    }
    else {
LAB_00b6c6f7:
      ctx->prot = 7;
LAB_00b6c6fe:
      iVar7 = 0;
    }
    return iVar7;
  }
LAB_00b6cf77:
  abort();
}

Assistant:

static int get_physical_address_wtlb(
    CPUPPCState *env, mmu_ctx_t *ctx,
    target_ulong eaddr, int rw, int access_type,
    int mmu_idx)
{
    int ret = -1;
    bool real_mode = (access_type == ACCESS_CODE && msr_ir == 0)
        || (access_type != ACCESS_CODE && msr_dr == 0);

    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            /* Try to find a BAT */
            if (env->nb_BATs != 0) {
                ret = get_bat_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
            if (ret < 0) {
                /* We didn't match any BAT entry or don't have BATs */
                ret = get_segment_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
        }
        break;

    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            ret = mmu40x_get_physical_address(env, ctx, eaddr,
                                              rw, access_type);
        }
        break;
    case POWERPC_MMU_BOOKE:
        ret = mmubooke_get_physical_address(env, ctx, eaddr,
                                            rw, access_type);
        break;
    case POWERPC_MMU_BOOKE206:
        ret = mmubooke206_get_physical_address(env, ctx, eaddr, rw,
                                               access_type, mmu_idx);
        break;
    case POWERPC_MMU_MPC8xx:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "MPC8xx MMU model is not implemented\n");
        break;
    case POWERPC_MMU_REAL:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            cpu_abort(env_cpu(env),
                      "PowerPC in real mode do not do any translation\n");
            return -1;
        }
        break;
    default:
        cpu_abort(env_cpu(env), "Unknown or invalid MMU model\n");
        return -1;
    }

    return ret;
}